

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

void __thiscall
NavierStokesBase::calc_dsdt(NavierStokesBase *this,Real param_2,Real dt,MultiFab *dsdt)

{
  bool bVar1;
  FabArray<amrex::FArrayBox> *in_RSI;
  undefined8 in_XMM1_Qa;
  Array4<double> *dsdtarr;
  Array4<double> *div_old;
  Array4<double> *div_new;
  Box *bx;
  MFIter mfi;
  MultiFab *Divu_old;
  MultiFab *Divu_new;
  undefined4 in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd8c;
  AmrLevel *in_stack_fffffffffffffd90;
  FabArray<amrex::FArrayBox> *this_00;
  undefined1 local_258 [15];
  undefined1 in_stack_fffffffffffffdb7;
  FabArrayBase *in_stack_fffffffffffffdb8;
  MFIter *in_stack_fffffffffffffdc0;
  anon_class_200_4_be44950b *in_stack_fffffffffffffdd0;
  Box *in_stack_fffffffffffffdd8;
  undefined1 auStack_218 [8];
  MFIter *in_stack_fffffffffffffdf0;
  undefined1 auStack_1d8 [64];
  double local_198;
  undefined1 local_190 [64];
  undefined1 *local_150;
  undefined1 local_148 [64];
  undefined1 *local_108;
  undefined1 local_100 [64];
  undefined1 *local_c0;
  undefined1 local_b4 [132];
  MultiFab *local_30;
  MultiFab *local_28;
  FabArray<amrex::FArrayBox> *local_20;
  double local_18 [3];
  
  if ((have_divu != 0) && (have_dsdt != 0)) {
    if (do_temp == 0) {
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffffd90,
                 (value_type)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    }
    else {
      local_20 = in_RSI;
      local_18[0] = (double)in_XMM1_Qa;
      local_28 = amrex::AmrLevel::get_new_data(in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c);
      local_30 = amrex::AmrLevel::get_old_data(in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c);
      amrex::TilingIfNotGPU();
      amrex::MFIter::MFIter
                (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,(bool)in_stack_fffffffffffffdb7
                );
      this_00 = local_20;
      while (bVar1 = amrex::MFIter::isValid((MFIter *)(local_b4 + 0x24)), bVar1) {
        amrex::MFIter::tilebox(in_stack_fffffffffffffdf0);
        local_b4._28_8_ = local_b4;
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (this_00,(MFIter *)in_stack_fffffffffffffd90);
        local_c0 = local_100;
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (this_00,(MFIter *)in_stack_fffffffffffffd90);
        local_108 = local_148;
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (this_00,(MFIter *)in_stack_fffffffffffffd90);
        local_150 = local_190;
        in_stack_fffffffffffffd90 = (AmrLevel *)local_b4._28_8_;
        memcpy(local_258,local_c0,0x3c);
        memcpy(auStack_218,local_108,0x3c);
        memcpy(auStack_1d8,local_150,0x3c);
        local_198 = local_18[0];
        amrex::ParallelFor<NavierStokesBase::calc_dsdt(double,double,amrex::MultiFab&)::__0>
                  (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
        amrex::MFIter::operator++((MFIter *)(local_b4 + 0x24));
      }
      amrex::MFIter::~MFIter((MFIter *)in_stack_fffffffffffffd90);
    }
  }
  return;
}

Assistant:

void
NavierStokesBase::calc_dsdt (Real      /*time*/,
                         Real      dt,
                         MultiFab& dsdt)
{
    if (have_divu && have_dsdt)
    {
        // Don't think we need this here. Instead, code will use FillPatch to
        // fill ghosts.
        //dsdt.setVal(0);

        if (do_temp) {
            MultiFab& Divu_new = get_new_data(Divu_Type);
            MultiFab& Divu_old = get_old_data(Divu_Type);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(dsdt,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                const Box&  bx      = mfi.tilebox();
                auto const& div_new = Divu_new.array(mfi);
                auto const& div_old = Divu_old.array(mfi);
                auto const& dsdtarr = dsdt.array(mfi);

                amrex::ParallelFor(bx, [div_new, div_old, dsdtarr, dt]
                AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                {
                    dsdtarr(i,j,k) = ( div_new(i,j,k) - div_old(i,j,k) )/ dt;
                });
            }
        }
        else
        {
            dsdt.setVal(0);
        }
    }
}